

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall
sf::RenderTarget::draw
          (RenderTarget *this,VertexBuffer *vertexBuffer,size_t firstVertex,size_t vertexCount,
          RenderStates *states)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  PrimitiveType type;
  size_t sVar4;
  ostream *poVar5;
  socklen_t __len;
  socklen_t __len_00;
  sockaddr *psVar6;
  ulong vertexCount_00;
  
  bVar1 = VertexBuffer::isAvailable();
  if (!bVar1) {
    poVar5 = err();
    poVar5 = std::operator<<(poVar5,"sf::VertexBuffer is not available, drawing skipped");
    std::endl<char,std::char_traits<char>>(poVar5);
    return;
  }
  sVar4 = VertexBuffer::getVertexCount(vertexBuffer);
  if (firstVertex <= sVar4) {
    sVar4 = VertexBuffer::getVertexCount(vertexBuffer);
    vertexCount_00 = sVar4 - firstVertex;
    if (vertexCount <= sVar4 - firstVertex) {
      vertexCount_00 = vertexCount;
    }
    if ((vertexCount_00 != 0) && (uVar2 = VertexBuffer::getNativeHandle(vertexBuffer), uVar2 != 0))
    {
      bVar1 = anon_unknown.dwarf_7de29::isActive(this->m_id);
      if ((!bVar1) && (iVar3 = (*this->_vptr_RenderTarget[3])(this), (char)iVar3 == '\0')) {
        return;
      }
      psVar6 = (sockaddr *)0x0;
      setupDraw(this,false,states);
      VertexBuffer::bind((int)vertexBuffer,psVar6,__len);
      if (((this->m_cache).enable != true) || ((this->m_cache).texCoordsArrayEnabled == false)) {
        glEnableClientState(0x8078);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                           ,0x173,"glEnableClientState(GL_TEXTURE_COORD_ARRAY)");
      }
      glVertexPointer(2,0x1406,0x14,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x175,
                         "glVertexPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(0))"
                        );
      glColorPointer(4,0x1401,0x14,8);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x176,
                         "glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), reinterpret_cast<const void*>(8))"
                        );
      glTexCoordPointer(2,0x1406,0x14,0xc);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x177,
                         "glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(12))"
                        );
      type = VertexBuffer::getPrimitiveType(vertexBuffer);
      psVar6 = (sockaddr *)(ulong)type;
      drawPrimitives((RenderTarget *)vertexBuffer,type,firstVertex,vertexCount_00);
      VertexBuffer::bind(0,psVar6,__len_00);
      cleanupDraw(this,states);
      (this->m_cache).texCoordsArrayEnabled = true;
      (this->m_cache).useVertexCache = false;
    }
  }
  return;
}

Assistant:

void RenderTarget::draw(const VertexBuffer& vertexBuffer, std::size_t firstVertex,
                        std::size_t vertexCount, const RenderStates& states)
{
    // VertexBuffer not supported?
    if (!VertexBuffer::isAvailable())
    {
        err() << "sf::VertexBuffer is not available, drawing skipped" << std::endl;
        return;
    }

    // Sanity check
    if (firstVertex > vertexBuffer.getVertexCount())
        return;

    // Clamp vertexCount to something that makes sense
    vertexCount = std::min(vertexCount, vertexBuffer.getVertexCount() - firstVertex);

    // Nothing to draw?
    if (!vertexCount || !vertexBuffer.getNativeHandle())
        return;

    // GL_QUADS is unavailable on OpenGL ES
    #ifdef SFML_OPENGL_ES
        if (vertexBuffer.getPrimitiveType() == Quads)
        {
            err() << "sf::Quads primitive type is not supported on OpenGL ES platforms, drawing skipped" << std::endl;
            return;
        }
    #endif

    if (isActive(m_id) || setActive(true))
    {
        setupDraw(false, states);

        // Bind vertex buffer
        VertexBuffer::bind(&vertexBuffer);

        // Always enable texture coordinates
        if (!m_cache.enable || !m_cache.texCoordsArrayEnabled)
            glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));

        glCheck(glVertexPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(0)));
        glCheck(glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), reinterpret_cast<const void*>(8)));
        glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(12)));

        drawPrimitives(vertexBuffer.getPrimitiveType(), firstVertex, vertexCount);

        // Unbind vertex buffer
        VertexBuffer::bind(NULL);

        cleanupDraw(states);

        // Update the cache
        m_cache.useVertexCache = false;
        m_cache.texCoordsArrayEnabled = true;
    }
}